

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeFrameRestore(VdbeFrame *pFrame)

{
  Vdbe *pVVar1;
  Vdbe *v;
  VdbeFrame *pFrame_local;
  
  pVVar1 = pFrame->v;
  pVVar1->aOnceFlag = pFrame->aOnceFlag;
  pVVar1->nOnceFlag = pFrame->nOnceFlag;
  pVVar1->aOp = pFrame->aOp;
  pVVar1->nOp = pFrame->nOp;
  pVVar1->aMem = pFrame->aMem;
  pVVar1->nMem = pFrame->nMem;
  pVVar1->apCsr = pFrame->apCsr;
  pVVar1->nCursor = pFrame->nCursor;
  pVVar1->db->lastRowid = pFrame->lastRowid;
  pVVar1->nChange = pFrame->nChange;
  return pFrame->pc;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeFrameRestore(VdbeFrame *pFrame){
  Vdbe *v = pFrame->v;
  v->aOnceFlag = pFrame->aOnceFlag;
  v->nOnceFlag = pFrame->nOnceFlag;
  v->aOp = pFrame->aOp;
  v->nOp = pFrame->nOp;
  v->aMem = pFrame->aMem;
  v->nMem = pFrame->nMem;
  v->apCsr = pFrame->apCsr;
  v->nCursor = pFrame->nCursor;
  v->db->lastRowid = pFrame->lastRowid;
  v->nChange = pFrame->nChange;
  return pFrame->pc;
}